

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cc
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  int i;
  long lVar6;
  int iVar7;
  
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = &PTR_createIterator_00103d30;
  puVar4 = (undefined8 *)operator_new__(0x14);
  *puVar4 = 0;
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  puVar3[1] = puVar4;
  lVar6 = 0;
  do {
    *(int *)((long)puVar4 + lVar6 * 4) = (int)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  *(undefined4 *)(puVar3 + 2) = 5;
  plVar5 = (long *)operator_new(0x18);
  *plVar5 = (long)&PTR_first_00103d80;
  plVar5[1] = (long)puVar3;
  *(undefined4 *)(plVar5 + 2) = 0;
  iVar7 = -1;
  do {
    iVar2 = (**(code **)(*plVar5 + 0x18))(plVar5);
    iVar7 = iVar7 + 1;
    if (iVar7 != iVar2) {
      __assert_fail("value == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                    ,0xe,"int main()");
    }
    (**(code **)(*plVar5 + 8))(plVar5);
    cVar1 = (**(code **)(*plVar5 + 0x10))(plVar5);
  } while (cVar1 == '\0');
  (**(code **)*plVar5)(plVar5);
  iVar7 = (**(code **)(*plVar5 + 0x18))(plVar5);
  if (iVar7 == 0) {
    return 0;
  }
  __assert_fail("value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                ,0x15,"int main()");
}

Assistant:

int main() {
  ConcreteAggregate* list = new ConcreteAggregate(5);
  Iterator* iterator = list->createIterator();
  int value;

  for (int i = 0; !iterator->isDone(); iterator->next()) {
    value = iterator->currentItem();
    assert(value == i);
    i++;
  }

  iterator->first();

  value = iterator->currentItem();
  assert(value == 0);
}